

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

string * el::base::utils::OS::currentUser_abi_cxx11_(void)

{
  char *in_RCX;
  string *in_RDI;
  char *in_R8;
  
  getEnvironmentVariable_abi_cxx11_(in_RDI,(OS *)"USER","user",in_RCX,in_R8);
  return in_RDI;
}

Assistant:

std::string OS::currentUser(void) {
#if ELPP_OS_UNIX && !ELPP_OS_ANDROID
  return getEnvironmentVariable("USER", base::consts::kUnknownUser, "whoami");
#elif ELPP_OS_WINDOWS
  return getEnvironmentVariable("USERNAME", base::consts::kUnknownUser);
#elif ELPP_OS_ANDROID
  ELPP_UNUSED(base::consts::kUnknownUser);
  return std::string("android");
#else
  return std::string();
#endif  // ELPP_OS_UNIX && !ELPP_OS_ANDROID
}